

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::CanIWriteThisFile(cmMakefile *this,char *fileName)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  allocator local_a4;
  allocator local_a3;
  allocator local_a2;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string
            ((string *)&local_a0,"CMAKE_DISABLE_SOURCE_CHANGES",(allocator *)&local_80);
  bVar1 = IsOn(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  bVar2 = true;
  if (bVar1) {
    pcVar3 = GetHomeDirectory(this);
    std::__cxx11::string::string((string *)&local_a0,pcVar3,(allocator *)&local_40);
    pcVar3 = GetHomeOutputDirectory(this);
    std::__cxx11::string::string((string *)&local_80,pcVar3,(allocator *)&local_60);
    bVar1 = cmsys::SystemTools::SameFile(&local_a0,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_a0,"CMAKE_DISABLE_IN_SOURCE_BUILD",(allocator *)&local_80);
      bVar2 = IsOn(this,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      bVar2 = !bVar2;
    }
    else {
      std::__cxx11::string::string((string *)&local_a0,fileName,&local_a1);
      pcVar3 = GetHomeDirectory(this);
      std::__cxx11::string::string((string *)&local_80,pcVar3,&local_a2);
      bVar1 = cmsys::SystemTools::IsSubDirectory(&local_a0,&local_80);
      bVar2 = true;
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_40,fileName,&local_a3);
        pcVar3 = GetHomeOutputDirectory(this);
        std::__cxx11::string::string((string *)&local_60,pcVar3,&local_a4);
        bVar2 = cmsys::SystemTools::IsSubDirectory(&local_40,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::__cxx11::string::~string((string *)&local_40);
      }
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  return bVar2;
}

Assistant:

bool cmMakefile::CanIWriteThisFile(const char* fileName) const
{
  if ( !this->IsOn("CMAKE_DISABLE_SOURCE_CHANGES") )
    {
    return true;
    }
  // If we are doing an in-source build, then the test will always fail
  if ( cmSystemTools::SameFile(this->GetHomeDirectory(),
                               this->GetHomeOutputDirectory()) )
    {
    if ( this->IsOn("CMAKE_DISABLE_IN_SOURCE_BUILD") )
      {
      return false;
      }
    return true;
    }

  // Check if this is a subdirectory of the source tree but not a
  // subdirectory of the build tree
  if ( cmSystemTools::IsSubDirectory(fileName,
      this->GetHomeDirectory()) &&
    !cmSystemTools::IsSubDirectory(fileName,
      this->GetHomeOutputDirectory()) )
    {
    return false;
    }
  return true;
}